

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  rawSeq *prVar1;
  BYTE *iend;
  U32 minMatch;
  BYTE *pBVar2;
  seqDef *psVar3;
  undefined8 uVar4;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  ZSTD_dictMode_e dictMode;
  ulong uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  
  if ((ms->window).lowLimit < (ms->window).dictLimit) {
    dictMode = ZSTD_extDict;
  }
  else {
    dictMode = (uint)(ms->dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE = ZSTD_selectBlockCompressor((ms->cParams).strategy,dictMode);
  uVar12 = rawSeqStore->pos;
  uVar7 = rawSeqStore->size;
  if (uVar7 < uVar12) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456d,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < uVar7) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456e,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  pBVar11 = (BYTE *)(srcSize + (long)src);
  while ((uVar14 = (long)pBVar11 - (long)src, uVar12 < uVar7 && (src < pBVar11))) {
    prVar1 = rawSeqStore->seq + uVar12;
    uVar7._0_4_ = prVar1->offset;
    uVar7._4_4_ = prVar1->litLength;
    if ((undefined4)uVar7 == 0) {
      __assert_fail("sequence.offset > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x454a,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
    }
    uVar9 = uVar7 >> 0x20;
    uVar8 = rawSeqStore->seq[uVar12].matchLength;
    uVar13 = (uint)uVar14;
    if (uVar13 < uVar7._4_4_ + uVar8) {
      ZSTD_ldm_skipSequences(rawSeqStore,uVar14 & 0xffffffff,minMatch);
      uVar12 = uVar7 & 0xffffffff;
      if (uVar13 - uVar7._4_4_ < minMatch) {
        uVar12 = 0;
      }
      uVar8 = uVar13 - uVar7._4_4_;
      if ((uVar13 < (uint)uVar7._4_4_ || uVar8 == 0) || (uVar7 = uVar12, uVar8 < minMatch)) break;
    }
    else {
      rawSeqStore->pos = uVar12 + 1;
    }
    iend = (BYTE *)((long)src + uVar9);
    if (pBVar11 < iend + uVar8) {
      __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4579,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                   );
    }
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
    ZSTD_ldm_fillFastTables(ms,src);
    sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar9);
    for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -4) {
      *(undefined4 *)((long)rep + lVar5) = *(undefined4 *)((long)rep + lVar5 + -4);
    }
    *rep = (U32)uVar7;
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar2 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar2 + sVar6) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pBVar11 < iend) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    pBVar10 = iend + -sVar6;
    if (pBVar11 + -0x20 < iend) {
      ZSTD_safecopyLiterals(pBVar2,pBVar10,iend,pBVar11 + -0x20);
LAB_00142f2c:
      seqStore->lit = seqStore->lit + sVar6;
      if (0xffff < sVar6) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar4 = *(undefined8 *)(pBVar10 + 8);
      *(undefined8 *)pBVar2 = *(undefined8 *)pBVar10;
      *(undefined8 *)(pBVar2 + 8) = uVar4;
      pBVar2 = seqStore->lit;
      if (0x10 < sVar6) {
        lVar5 = (long)(pBVar2 + 0x10) - (long)(pBVar10 + 0x10);
        if (lVar5 < 8) {
          if (-0x10 < lVar5) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
        }
        else if (0xffffffffffffffe0 < lVar5 - 0x10U) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar4 = *(undefined8 *)(pBVar10 + 0x18);
        *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(pBVar10 + 0x10);
        *(undefined8 *)(pBVar2 + 0x18) = uVar4;
        if (0x20 < (long)sVar6) {
          lVar5 = 0;
          do {
            uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar5 + (uVar9 - sVar6) + 0x20) + 8);
            pBVar10 = pBVar2 + lVar5 + 0x20;
            *(undefined8 *)pBVar10 = *(undefined8 *)((long)src + lVar5 + (uVar9 - sVar6) + 0x20);
            *(undefined8 *)(pBVar10 + 8) = uVar4;
            uVar4 = *(undefined8 *)((BYTE *)((long)src + lVar5 + (uVar9 - sVar6) + 0x30) + 8);
            *(undefined8 *)(pBVar10 + 0x10) =
                 *(undefined8 *)((long)src + lVar5 + (uVar9 - sVar6) + 0x30);
            *(undefined8 *)(pBVar10 + 0x18) = uVar4;
            lVar5 = lVar5 + 0x20;
          } while (pBVar10 + 0x20 < pBVar2 + sVar6);
        }
        goto LAB_00142f2c;
      }
      seqStore->lit = pBVar2 + sVar6;
    }
    psVar3 = seqStore->sequences;
    psVar3->litLength = (U16)sVar6;
    psVar3->offset = (U32)uVar7 + 3;
    if (0xffff < uVar8 - 3) {
      if (seqStore->longLengthID != 0) {
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar3 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar3->matchLength = (U16)(uVar8 - 3);
    seqStore->sequences = psVar3 + 1;
    uVar12 = rawSeqStore->pos;
    uVar7 = rawSeqStore->size;
    src = iend + uVar8;
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
  ZSTD_ldm_fillFastTables(ms,src);
  sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar14);
  return sVar6;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}